

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O3

void __thiscall
glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
          (SubTypeIterator<glu::IsBasicType> *this,VarType *type)

{
  this->m_type = type;
  (this->m_path).super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_path).super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_path).super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (type != (VarType *)0x0) {
    findNext(this);
  }
  return;
}

Assistant:

SubTypeIterator<IsExpanded>::SubTypeIterator (const VarType* type)
	: m_type(type)
{
	if (m_type)
		findNext();
}